

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v5::float_spec_handler<char>::on_fixed(float_spec_handler<char> *this)

{
  float_spec_handler<char> *this_local;
  
  if (this->type == 'F') {
    this->upper = true;
  }
  return;
}

Assistant:

void on_fixed() {
    if (type == 'F') {
      upper = true;
#if FMT_MSC_VER
      // MSVC's printf doesn't support 'F'.
      type = 'f';
#endif
    }
  }